

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int verify_table(void *buf,flatbuffers_uoffset_t end,flatbuffers_uoffset_t base,
                flatbuffers_uoffset_t offset,int ttl,flatcc_table_verifier_f *tvf)

{
  int iVar1;
  flatbuffers_uoffset_t base_00;
  flatbuffers_uoffset_t fVar2;
  int c_7;
  int c_6;
  int c_5;
  int c_4;
  int c_3;
  int c_2;
  int c_1;
  int c;
  flatcc_table_verifier_descriptor_t td;
  flatbuffers_uoffset_t vend;
  flatbuffers_uoffset_t vbase;
  flatcc_table_verifier_f *tvf_local;
  int ttl_local;
  flatbuffers_uoffset_t offset_local;
  flatbuffers_uoffset_t base_local;
  flatbuffers_uoffset_t end_local;
  void *buf_local;
  
  td.buf._4_4_ = ttl + -1;
  if (td.buf._4_4_ == 0) {
    buf_local._4_4_ = 3;
  }
  else {
    iVar1 = check_header(end,base,offset);
    if (iVar1 == 0) {
      buf_local._4_4_ = 0xf;
    }
    else {
      base_00 = base + offset;
      td.vtable._0_4_ = base_00;
      fVar2 = read_uoffset(buf,base_00);
      td._28_4_ = base_00 - fVar2;
      if ((int)td._28_4_ < 0 || (td._28_4_ & 1) != 0) {
        buf_local._4_4_ = 0x1d;
      }
      else if ((ulong)end < (ulong)(uint)td._28_4_ + 2) {
        buf_local._4_4_ = 0x1b;
      }
      else {
        td.vtable._6_2_ = read_voffset(buf,td._28_4_);
        td.table = td._28_4_ + (uint)td.vtable._6_2_;
        if (end < td.table || (td.vtable._6_2_ & 1) != 0) {
          buf_local._4_4_ = 0x1e;
        }
        else if (td.vtable._6_2_ < 4) {
          buf_local._4_4_ = 0x1c;
        }
        else {
          td.vtable._4_2_ = read_voffset(buf,td._28_4_ + 2);
          if (end - (flatbuffers_uoffset_t)td.vtable < (uint)td.vtable._4_2_) {
            buf_local._4_4_ = 0x14;
          }
          else {
            td._8_8_ = (long)buf + (ulong)(uint)td._28_4_;
            _c_1 = buf;
            td.buf._0_4_ = end;
            buf_local._4_4_ = (*tvf)((flatcc_table_verifier_descriptor_t *)&c_1);
          }
        }
      }
    }
  }
  return buf_local._4_4_;
}

Assistant:

static inline int verify_table(const void *buf, uoffset_t end, uoffset_t base, uoffset_t offset,
        int ttl, flatcc_table_verifier_f tvf)
{
    uoffset_t vbase, vend;
    flatcc_table_verifier_descriptor_t td;

    verify((td.ttl = ttl - 1), flatcc_verify_error_max_nesting_level_reached);
    verify(check_header(end, base, offset), flatcc_verify_error_table_header_out_of_range_or_unaligned);
    td.table = base + offset;
    /* Read vtable offset - it is signed, but we want it unsigned, assuming 2's complement works. */
    vbase = td.table - read_uoffset(buf, td.table);
    verify((soffset_t)vbase >= 0 && !(vbase & (voffset_size - 1)), flatcc_verify_error_vtable_offset_out_of_range_or_unaligned);
    verify(vbase + voffset_size <= end, flatcc_verify_error_vtable_header_out_of_range);
    /* Read vtable size. */
    td.vsize = read_voffset(buf, vbase);
    vend = vbase + td.vsize;
    verify(vend <= end && !(td.vsize & (voffset_size - 1)), flatcc_verify_error_vtable_size_out_of_range_or_unaligned);
    /* Optimizes away overflow check if uoffset_t is large enough. */
    verify(uoffset_size > voffset_size || vend >= vbase, flatcc_verify_error_vtable_size_overflow);

    verify(td.vsize >= 2 * voffset_size, flatcc_verify_error_vtable_header_too_small);
    /* Read table size. */
    td.tsize = read_voffset(buf, vbase + voffset_size);
    verify(end - td.table >= td.tsize, flatcc_verify_error_table_size_out_of_range);
    td.vtable = (uint8_t *)buf + vbase;
    td.buf = buf;
    td.end = end;
    return tvf(&td);
}